

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_decompressSequences_default
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset)

{
  int iVar1;
  BYTE *base;
  BYTE *vBase_00;
  ulong uVar2;
  seq_t sequence_00;
  BYTE *pBVar3;
  BYTE *pBVar4;
  uint uVar5;
  BIT_DStream_status BVar6;
  BYTE *litLimit;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  void *__src;
  size_t __n;
  ulong uVar13;
  BIT_DStream_t *pBVar14;
  char **ppcVar15;
  size_t local_328;
  size_t local_318;
  long local_308;
  U32 local_2f0;
  int nbSeq_local;
  size_t seqSize_local;
  void *seqStart_local;
  size_t maxDstSize_local;
  void *dst_local;
  ZSTD_DCtx *dctx_local;
  size_t lastLLSize;
  U32 i_2;
  size_t oneSeqSize;
  seq_t sequence;
  size_t errcod;
  undefined1 local_270 [4];
  U32 i;
  seqState_t seqState;
  BYTE *dictEnd;
  BYTE *vBase;
  BYTE *prefixStart;
  BYTE *litEnd;
  BYTE *litPtr;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *iend;
  BYTE *ip;
  size_t local_190;
  void *local_188;
  size_t local_180;
  void *local_178;
  ZSTD_DCtx *local_170;
  BYTE *local_168;
  ulong local_160;
  size_t temp;
  ulong uStack_150;
  U32 extraBits;
  size_t offset;
  U32 ofBase;
  U32 mlBase;
  U32 llBase;
  U32 totalBits;
  U32 ofBits;
  U32 mlBits;
  U32 llBits;
  size_t local_120;
  size_t lowBits_2;
  ulong uStack_110;
  U32 nbBits_2;
  ZSTD_seqSymbol DInfo_2;
  size_t lowBits_1;
  byte bStack_e5;
  U32 nbBits_1;
  ZSTD_seqSymbol DInfo_1;
  size_t lowBits;
  byte bStack_bd;
  U32 nbBits;
  ZSTD_seqSymbol DInfo;
  size_t local_a0;
  uint local_84;
  int sub2;
  U32 i_1;
  size_t length1;
  BYTE *match;
  BYTE *iLitEnd;
  BYTE *oend_w;
  BYTE *oMatchEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  BYTE *local_18;
  size_t local_10;
  
  ip._0_4_ = isLongOffset;
  ostart = (BYTE *)((long)seqStart + seqSize);
  op = (BYTE *)((long)dst + maxDstSize);
  litEnd = dctx->litPtr;
  litLimit = litEnd + dctx->litSize;
  base = (BYTE *)dctx->prefixStart;
  vBase_00 = (BYTE *)dctx->virtualStart;
  seqState.pos = (size_t)dctx->dictEnd;
  litPtr = (BYTE *)dst;
  oend = (BYTE *)dst;
  iend = (BYTE *)seqStart;
  ip._4_4_ = nbSeq;
  local_190 = seqSize;
  local_188 = seqStart;
  local_180 = maxDstSize;
  local_178 = dst;
  local_170 = dctx;
  if (nbSeq != 0) {
    dctx->fseEntropy = 1;
    for (errcod._4_4_ = 0; errcod._4_4_ < 3; errcod._4_4_ = errcod._4_4_ + 1) {
      seqState.prevOffset[(ulong)errcod._4_4_ - 1] = (ulong)(dctx->entropy).rep[errcod._4_4_];
    }
    sVar7 = BIT_initDStream((BIT_DStream_t *)local_270,seqStart,(long)ostart - (long)seqStart);
    uVar5 = ERR_isError(sVar7);
    if (uVar5 != 0) {
      return 0xffffffffffffffec;
    }
    ZSTD_initFseState((ZSTD_fseState *)&seqState.DStream.limitPtr,(BIT_DStream_t *)local_270,
                      local_170->LLTptr);
    ZSTD_initFseState((ZSTD_fseState *)&seqState.stateLL.table,(BIT_DStream_t *)local_270,
                      local_170->OFTptr);
    ZSTD_initFseState((ZSTD_fseState *)&seqState.stateOffb.table,(BIT_DStream_t *)local_270,
                      local_170->MLTptr);
    while (BVar6 = BIT_reloadDStream((BIT_DStream_t *)local_270),
          BVar6 < BIT_DStream_overflow && ip._4_4_ != 0) {
      ip._4_4_ = ip._4_4_ + -1;
      _llBits = (ZSTD_seqSymbol)local_270;
      mlBits = (ZSTD_longOffset_e)ip;
      ofBits = (U32)*(byte *)(seqState.stateLL.state + 2 + (long)seqState.DStream.limitPtr * 8);
      totalBits = (U32)*(byte *)(seqState.stateML.state + 2 + (long)seqState.stateOffb.table * 8);
      llBase = (U32)*(byte *)(seqState.stateOffb.state + 2 + (long)seqState.stateLL.table * 8);
      mlBase = ofBits + totalBits + llBase;
      ofBase = *(U32 *)(seqState.stateLL.state + 4 + (long)seqState.DStream.limitPtr * 8);
      offset._4_4_ = *(uint *)(seqState.stateML.state + 4 + (long)seqState.stateOffb.table * 8);
      offset._0_4_ = *(uint *)(seqState.stateOffb.state + 4 + (long)seqState.stateLL.table * 8);
      if (llBase == 0) {
        uStack_150 = 0;
      }
      else {
        uVar5 = MEM_32bits();
        if (((uVar5 == 0) || (mlBits == 0)) || (llBase < 0x19)) {
          uVar13 = (ulong)(uint)offset;
          sVar7 = BIT_readBitsFast((BIT_DStream_t *)_llBits,llBase);
          uStack_150 = uVar13 + sVar7;
          uVar5 = MEM_32bits();
          if (uVar5 != 0) {
            BIT_reloadDStream((BIT_DStream_t *)_llBits);
          }
        }
        else {
          if (llBase < 0x20 - *(uint *)((long)_llBits + 8)) {
            local_2f0 = llBase;
          }
          else {
            local_2f0 = 0x20 - *(uint *)((long)_llBits + 8);
          }
          temp._4_4_ = llBase - local_2f0;
          uVar13 = (ulong)(uint)offset;
          sVar7 = BIT_readBitsFast((BIT_DStream_t *)_llBits,llBase - temp._4_4_);
          uStack_150 = uVar13 + (sVar7 << ((byte)temp._4_4_ & 0x3f));
          BIT_reloadDStream((BIT_DStream_t *)_llBits);
          if (temp._4_4_ != 0) {
            sVar7 = BIT_readBitsFast((BIT_DStream_t *)_llBits,temp._4_4_);
            uStack_150 = sVar7 + uStack_150;
          }
        }
      }
      if (llBase < 2) {
        lVar8 = (long)(int)(uint)(ofBase == 0) + uStack_150;
        if (lVar8 == 0) {
          uStack_150 = *(ulong *)((long)_llBits + 0x58);
        }
        else {
          if (lVar8 == 3) {
            local_308 = *(long *)((long)_llBits + 0x58) + -1;
          }
          else {
            local_308 = *(long *)((uint *)((long)_llBits + 0x58) + lVar8 * 2);
          }
          local_160 = (int)(uint)((local_308 != 0 ^ 0xffU) & 1) + local_308;
          if (lVar8 != 1) {
            *(char **)((long)_llBits + 0x68) = *(char **)((long)_llBits + 0x60);
          }
          *(char **)((long)_llBits + 0x60) = *(char **)((long)_llBits + 0x58);
          uStack_150 = local_160;
          *(ulong *)((long)_llBits + 0x58) = local_160;
        }
      }
      else {
        *(char **)((long)_llBits + 0x68) = *(char **)((long)_llBits + 0x60);
        *(char **)((long)_llBits + 0x60) = *(char **)((long)_llBits + 0x58);
        *(ulong *)((long)_llBits + 0x58) = uStack_150;
      }
      uVar13 = uStack_150;
      uVar9 = (ulong)offset._4_4_;
      if (totalBits == 0) {
        local_318 = 0;
      }
      else {
        local_318 = BIT_readBitsFast((BIT_DStream_t *)_llBits,totalBits);
      }
      local_a0 = uVar9 + local_318;
      uVar5 = MEM_32bits();
      if ((uVar5 != 0) && (0x13 < totalBits + ofBits)) {
        BIT_reloadDStream((BIT_DStream_t *)_llBits);
      }
      uVar5 = MEM_64bits();
      if ((uVar5 != 0) && (0x1e < mlBase)) {
        BIT_reloadDStream((BIT_DStream_t *)_llBits);
      }
      uVar9 = (ulong)ofBase;
      if (ofBits == 0) {
        local_328 = 0;
      }
      else {
        local_328 = BIT_readBitsFast((BIT_DStream_t *)_llBits,ofBits);
      }
      uVar9 = uVar9 + local_328;
      uVar5 = MEM_32bits();
      if (uVar5 != 0) {
        BIT_reloadDStream((BIT_DStream_t *)_llBits);
      }
      pBVar14 = (BIT_DStream_t *)((long)_llBits + 0x28);
      uVar2 = *(ulong *)(*(long *)((long)_llBits + 0x30) + pBVar14->bitContainer * 8);
      bStack_bd = (byte)(uVar2 >> 0x18);
      sVar7 = BIT_readBits((BIT_DStream_t *)_llBits,(uint)bStack_bd);
      pBVar14->bitContainer = (uVar2 & 0xffff) + sVar7;
      ppcVar15 = (char **)((long)_llBits + 0x48);
      uVar2 = *(ulong *)(((BIT_DStream_t *)((long)_llBits + 0x50))->bitContainer +
                        (long)*ppcVar15 * 8);
      bStack_e5 = (byte)(uVar2 >> 0x18);
      sVar7 = BIT_readBits((BIT_DStream_t *)_llBits,(uint)bStack_e5);
      *ppcVar15 = (char *)((uVar2 & 0xffff) + sVar7);
      uVar5 = MEM_32bits();
      if (uVar5 != 0) {
        BIT_reloadDStream((BIT_DStream_t *)_llBits);
      }
      ppcVar15 = (char **)((long)_llBits + 0x38);
      DInfo_2 = _llBits;
      uStack_110._3_1_ =
           (byte)(*(ulong *)(*(char **)((long)_llBits + 0x40) + (long)*ppcVar15 * 8) >> 0x18);
      lowBits_2._4_4_ = (uint)uStack_110._3_1_;
      uStack_110 = *(ulong *)(*(char **)((long)_llBits + 0x40) + (long)*ppcVar15 * 8);
      local_120 = BIT_readBits((BIT_DStream_t *)_llBits,lowBits_2._4_4_);
      *ppcVar15 = (char *)((uStack_110 & 0xffff) + local_120);
      pBVar4 = op;
      pBVar3 = litPtr;
      sVar7 = seqState.pos;
      local_18 = litPtr + uVar9;
      local_10 = uVar9 + local_a0;
      pBVar10 = litPtr + local_10;
      pBVar11 = op + -8;
      pBVar12 = litEnd + uVar9;
      if (op < pBVar10) {
        local_10 = 0xffffffffffffffba;
      }
      else if (litLimit < pBVar12) {
        local_10 = 0xffffffffffffffec;
      }
      else if (pBVar11 < local_18) {
        sequence_00.matchLength = local_a0;
        sequence_00.litLength = uVar9;
        sequence_00.offset = uVar13;
        sequence_00.match = (BYTE *)sequence.offset;
        local_10 = ZSTD_execSequenceLast7
                             (litPtr,op,sequence_00,&litEnd,litLimit,base,vBase_00,
                              (BYTE *)seqState.pos);
      }
      else {
        ZSTD_copy8(litPtr,litEnd);
        if (8 < uVar9) {
          ZSTD_wildcopy(pBVar3 + 8,litEnd + 8,uVar9 - 8);
        }
        litEnd = pBVar12;
        length1 = (long)local_18 - uVar13;
        if ((ulong)((long)local_18 - (long)base) < uVar13) {
          if ((ulong)((long)local_18 - (long)vBase_00) < uVar13) {
            local_10 = 0xffffffffffffffec;
          }
          else {
            __src = (void *)(sVar7 + (((long)local_18 - uVar13) - (long)base));
            if (sVar7 < (long)__src + local_a0) {
              __n = sVar7 - (long)__src;
              memmove(local_18,__src,__n);
              local_18 = local_18 + __n;
              local_a0 = local_a0 - __n;
              if ((local_18 <= pBVar11) && (length1 = (size_t)base, 2 < local_a0))
              goto LAB_00776c6c;
              for (local_84 = 0; local_84 < local_a0; local_84 = local_84 + 1) {
                local_18[local_84] = base[local_84];
              }
            }
            else {
              memmove(local_18,__src,local_a0);
            }
          }
        }
        else {
LAB_00776c6c:
          if (uVar13 < 8) {
            iVar1 = *(int *)(ZSTD_execSequence_dec64table + uVar13 * 4);
            *local_18 = *(BYTE *)length1;
            local_18[1] = *(BYTE *)(length1 + 1);
            local_18[2] = *(BYTE *)(length1 + 2);
            local_18[3] = *(BYTE *)(length1 + 3);
            uVar5 = *(uint *)(ZSTD_execSequence_dec32table + uVar13 * 4);
            ZSTD_copy4(local_18 + 4,(void *)(length1 + uVar5));
            length1 = (long)(length1 + uVar5) - (long)iVar1;
          }
          else {
            ZSTD_copy8(local_18,(void *)length1);
          }
          local_18 = local_18 + 8;
          length1 = length1 + 8;
          if (pBVar4 + -0xd < pBVar10) {
            if (local_18 < pBVar11) {
              ZSTD_wildcopy(local_18,(void *)length1,(long)pBVar11 - (long)local_18);
              length1 = ((long)pBVar11 - (long)local_18) + length1;
              local_18 = pBVar11;
            }
            while (local_18 < pBVar10) {
              *local_18 = *(BYTE *)length1;
              length1 = length1 + 1;
              local_18 = local_18 + 1;
            }
          }
          else {
            ZSTD_wildcopy(local_18,(void *)length1,local_a0 - 8);
          }
        }
      }
      uVar5 = ERR_isError(local_10);
      if (uVar5 != 0) {
        return local_10;
      }
      litPtr = litPtr + local_10;
    }
    if (ip._4_4_ != 0) {
      return 0xffffffffffffffec;
    }
    for (lastLLSize._4_4_ = 0; lastLLSize._4_4_ < 3; lastLLSize._4_4_ = lastLLSize._4_4_ + 1) {
      (local_170->entropy).rep[lastLLSize._4_4_] =
           (U32)seqState.prevOffset[(ulong)lastLLSize._4_4_ - 1];
    }
  }
  uVar13 = (long)litLimit - (long)litEnd;
  if ((ulong)((long)op - (long)litPtr) < uVar13) {
    local_168 = (BYTE *)0xffffffffffffffba;
  }
  else {
    memcpy(litPtr,litEnd,uVar13);
    local_168 = litPtr + (uVar13 - (long)oend);
  }
  return (size_t)local_168;
}

Assistant:

static size_t
ZSTD_decompressSequences_default(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset);
}